

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiSolvers.cc
# Opt level: O0

bool __thiscall Glucose::MultiSolvers::eliminate(MultiSolvers *this)

{
  ParallelSolver *pPVar1;
  long in_RDI;
  undefined1 unaff_retaddr;
  SimpSolver *in_stack_00000008;
  SimpSolver *s;
  bool local_1;
  
  pPVar1 = getPrimarySolver((MultiSolvers *)0x12fc88);
  (pPVar1->super_SimpSolver).use_simplification = (bool)(*(byte *)(in_RDI + 0x10) & 1);
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    local_1 = true;
  }
  else {
    local_1 = SimpSolver::eliminate(in_stack_00000008,(bool)unaff_retaddr);
  }
  return local_1;
}

Assistant:

bool MultiSolvers::eliminate() {

    // TODO allow variable elimination when all threads are built!
    assert(allClonesAreBuilt == false);

    SimpSolver *s = (SimpSolver *) getPrimarySolver();
    s->use_simplification = use_simplification;
    if(!use_simplification) return true;

    return s->eliminate(true);
}